

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void __thiscall TestCase::TestCase(TestCase *this,char *thread_name)

{
  char *thread_name_local;
  TestCase *this_local;
  
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_00106d38;
  std::__cxx11::string::string((string *)&this->mTestName);
  JHThread::Runnable<TestCase>::Runnable(&this->mThread,thread_name,this,0x11,false,0);
  Mutex::Mutex(&this->mMutex,false);
  std::__cxx11::string::string((string *)&this->mFilename);
  std::__cxx11::string::string((string *)&this->mErrorString);
  return;
}

Assistant:

TestCase( const char *thread_name ) : mThread( thread_name, this, &TestCase::Run ) 
	{
	}